

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O3

void RestoreModel(CPpmd8 *p,CTX_PTR c1)

{
  Byte *pBVar1;
  CPpmd_Void_Ref *pCVar2;
  byte bVar3;
  UInt32 UVar4;
  uint uVar5;
  CPpmd8_Context *pCVar6;
  long lVar7;
  ushort uVar8;
  int iVar9;
  ulong uVar10;
  CPpmd_Void_Ref *pCVar11;
  int *piVar12;
  Byte *pBVar13;
  CTX_PTR ctx;
  int local_b8 [38];
  
  ctx = p->MaxContext;
  pBVar13 = p->Base;
  p->Text = pBVar13 + p->AlignOffset;
  for (; ctx != c1; ctx = (CTX_PTR)(pBVar13 + ctx->Suffix)) {
    bVar3 = ctx->NumStats - 1;
    ctx->NumStats = bVar3;
    if (bVar3 == 0) {
      uVar10 = (ulong)ctx->Stats;
      pBVar1 = pBVar13 + uVar10;
      ctx->Flags = (0x3f < pBVar13[uVar10]) << 3 | ctx->Flags & 0x10;
      *(undefined2 *)((long)&ctx->Stats + 2) = *(undefined2 *)(pBVar13 + uVar10 + 4);
      *(undefined4 *)&ctx->SummFreq = *(undefined4 *)(pBVar13 + uVar10);
      if (p->UnitsStart == pBVar1) {
        p->UnitsStart = p->UnitsStart + 0xc;
      }
      else {
        pBVar1[0] = 0xff;
        pBVar1[1] = 0xff;
        pBVar1[2] = 0xff;
        pBVar1[3] = 0xff;
        *(CPpmd_Void_Ref *)(pBVar1 + 4) = p->FreeList[0];
        *(uint *)(pBVar1 + 8) = (uint)p->Indx2Units[0];
        p->FreeList[0] = (int)pBVar1 - *(int *)&p->Base;
        p->Stamps[0] = p->Stamps[0] + 1;
      }
      *(char *)((long)&ctx->SummFreq + 1) = (char)(*(byte *)((long)&ctx->SummFreq + 1) + 0xb >> 3);
    }
    else {
      Refresh(p,ctx,bVar3 + 3 >> 1,0);
    }
    pBVar13 = p->Base;
  }
  pCVar6 = p->MinContext;
  for (; ctx != pCVar6; ctx = (CTX_PTR)(pBVar13 + ctx->Suffix)) {
    bVar3 = ctx->NumStats;
    if (bVar3 == 0) {
      bVar3 = *(byte *)((long)&ctx->SummFreq + 1);
      *(byte *)((long)&ctx->SummFreq + 1) = bVar3 - (bVar3 >> 1);
    }
    else {
      uVar8 = ctx->SummFreq + 4;
      ctx->SummFreq = uVar8;
      if ((ushort)((ushort)bVar3 * 4 + 0x80) < uVar8) {
        Refresh(p,ctx,bVar3 + 2 >> 1,1);
        pCVar6 = p->MinContext;
        pBVar13 = p->Base;
      }
    }
  }
  if ((p->RestoreMethod == 0) || (UVar4 = GetUsedMemory(p), UVar4 < p->Size >> 1)) {
    RestartModel(p);
    return;
  }
  uVar5 = p->MaxContext->Suffix;
  if (uVar5 != 0) {
    do {
      uVar10 = (ulong)uVar5;
      uVar5 = *(uint *)(pBVar13 + uVar10 + 8);
    } while (uVar5 != 0);
    p->MaxContext = (CPpmd8_Context *)(pBVar13 + uVar10);
  }
  do {
    CutOff(p,p->MaxContext,0);
    memset(local_b8,0,0x98);
    pBVar13 = p->LoUnit;
    if (pBVar13 != p->HiUnit) {
      pBVar13[0] = '\0';
      pBVar13[1] = '\0';
      pBVar13[2] = '\0';
      pBVar13[3] = '\0';
    }
    for (piVar12 = (int *)p->UnitsStart; *piVar12 == -1; piVar12 = piVar12 + (ulong)uVar5 * 3) {
      *piVar12 = 0;
      uVar5 = piVar12[2];
      local_b8[p->Units2Indx[uVar5 - 1]] = local_b8[p->Units2Indx[uVar5 - 1]] + 1;
    }
    p->UnitsStart = (Byte *)piVar12;
    lVar7 = 0;
    do {
      iVar9 = local_b8[lVar7];
      if (iVar9 != 0) {
        pBVar13 = p->Base;
        pCVar2 = p->FreeList + lVar7;
        do {
          pCVar11 = pCVar2;
          uVar5 = *pCVar11;
          while (piVar12 = (int *)(pBVar13 + uVar5), pCVar2 = (CPpmd_Void_Ref *)(piVar12 + 1),
                *piVar12 == 0) {
            uVar5 = piVar12[1];
            *pCVar11 = uVar5;
            p->Stamps[lVar7] = p->Stamps[lVar7] - 1;
            iVar9 = iVar9 + -1;
            local_b8[lVar7] = iVar9;
            if (iVar9 == 0) goto LAB_00188d19;
          }
        } while( true );
      }
LAB_00188d19:
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x26);
    UVar4 = GetUsedMemory(p);
    if (UVar4 <= (p->Size >> 2) * 3) {
      p->GlueCount = 0;
      p->OrderFall = p->MaxOrder;
      return;
    }
  } while( true );
}

Assistant:

static void RestoreModel(CPpmd8 *p, CTX_PTR c1
    #ifdef PPMD8_FREEZE_SUPPORT
    , CTX_PTR fSuccessor
    #endif
    )
{
  CTX_PTR c;
  CPpmd_State *s;
  RESET_TEXT(0);
  for (c = p->MaxContext; c != c1; c = SUFFIX(c))
    if (--(c->NumStats) == 0)
    {
      s = STATS(c);
      c->Flags = (Byte)((c->Flags & 0x10) + 0x08 * (s->Symbol >= 0x40));
      *ONE_STATE(c) = *s;
      SpecialFreeUnit(p, s);
      ONE_STATE(c)->Freq = (Byte)(((unsigned)ONE_STATE(c)->Freq + 11) >> 3);
    }
    else
      Refresh(p, c, (c->NumStats+3) >> 1, 0);
 
  for (; c != p->MinContext; c = SUFFIX(c))
    if (!c->NumStats)
      ONE_STATE(c)->Freq = (Byte)(ONE_STATE(c)->Freq - (ONE_STATE(c)->Freq >> 1));
    else if ((c->SummFreq += 4) > 128 + 4 * c->NumStats)
      Refresh(p, c, (c->NumStats + 2) >> 1, 1);

  #ifdef PPMD8_FREEZE_SUPPORT
  if (p->RestoreMethod > PPMD8_RESTORE_METHOD_FREEZE)
  {
    p->MaxContext = fSuccessor;
    p->GlueCount += !(p->Stamps[1] & 1);
  }
  else if (p->RestoreMethod == PPMD8_RESTORE_METHOD_FREEZE)
  {
    while (p->MaxContext->Suffix)
      p->MaxContext = SUFFIX(p->MaxContext);
    RemoveBinContexts(p, p->MaxContext, 0);
    p->RestoreMethod++;
    p->GlueCount = 0;
    p->OrderFall = p->MaxOrder;
  }
  else
  #endif
  if (p->RestoreMethod == PPMD8_RESTORE_METHOD_RESTART || GetUsedMemory(p) < (p->Size >> 1))
    RestartModel(p);
  else
  {
    while (p->MaxContext->Suffix)
      p->MaxContext = SUFFIX(p->MaxContext);
    do
    {
      CutOff(p, p->MaxContext, 0);
      ExpandTextArea(p);
    }
    while (GetUsedMemory(p) > 3 * (p->Size >> 2));
    p->GlueCount = 0;
    p->OrderFall = p->MaxOrder;
  }
}